

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.hpp
# Opt level: O0

void __thiscall
tcu::TextureFormatInfo::TextureFormatInfo
          (TextureFormatInfo *this,Vec4 *valueMin_,Vec4 *valueMax_,Vec4 *lookupScale_,
          Vec4 *lookupBias_)

{
  Vec4 *lookupBias__local;
  Vec4 *lookupScale__local;
  Vec4 *valueMax__local;
  Vec4 *valueMin__local;
  TextureFormatInfo *this_local;
  
  Vector<float,_4>::Vector(&this->valueMin,valueMin_);
  Vector<float,_4>::Vector(&this->valueMax,valueMax_);
  Vector<float,_4>::Vector(&this->lookupScale,lookupScale_);
  Vector<float,_4>::Vector(&this->lookupBias,lookupBias_);
  return;
}

Assistant:

TextureFormatInfo (const Vec4& valueMin_, const Vec4& valueMax_, const Vec4& lookupScale_, const Vec4& lookupBias_)
		: valueMin		(valueMin_)
		, valueMax		(valueMax_)
		, lookupScale	(lookupScale_)
		, lookupBias	(lookupBias_)
	{
	}